

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O3

bool __thiscall
cmsys::Glob::RecurseDirectory(Glob *this,size_type start,string *dir,GlobMessages *messages)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer pRVar3;
  pointer pbVar4;
  size_type sVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  Status SVar9;
  long *plVar10;
  unsigned_long uVar11;
  char *__s;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  size_type *psVar14;
  undefined8 uVar15;
  ulong uVar16;
  _Alloc_hider _Var17;
  RegularExpression *this_00;
  ulong *puVar18;
  bool bVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string message;
  string fname;
  string realname;
  string canonicalPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  Directory d;
  string errorMessage;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b0;
  _Alloc_hider local_1a8;
  undefined1 local_1a0 [24];
  GlobMessages *local_188;
  string local_180;
  ulong *local_160;
  long local_158;
  ulong local_150;
  undefined4 uStack_148;
  undefined4 uStack_144;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  ulong local_118;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  Directory local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a8;
  size_type local_a0;
  size_type local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_188 = messages;
  local_98 = start;
  Directory::Directory(&local_b0);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_120 = dir;
  SVar9 = Directory::Load(&local_b0,dir,&local_90);
  if (SVar9.Kind_ == Success) {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    local_110._M_string_length = 0;
    local_110.field_2._M_allocated_capacity =
         local_110.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    local_140._M_string_length = 0;
    local_118 = 0;
    local_140.field_2._M_allocated_capacity =
         local_140.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_a0 = local_98 + 1;
    local_a8 = &this->VisitedSymlinks;
    while( true ) {
      uVar11 = Directory::GetNumberOfFiles(&local_b0);
      bVar19 = uVar11 <= local_118;
      if (bVar19) break;
      __s = Directory::GetFile(&local_b0,local_118);
      sVar5 = local_140._M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&local_140,0,(char *)sVar5,(ulong)__s);
      iVar8 = std::__cxx11::string::compare((char *)&local_140);
      if ((iVar8 != 0) && (iVar8 = std::__cxx11::string::compare((char *)&local_140), iVar8 != 0)) {
        if (local_98 == 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1b0,local_120,&local_140);
          uVar16 = local_118;
          std::__cxx11::string::operator=((string *)&local_110,(string *)&local_1b0);
          uVar15 = local_1a0._0_8_;
          _Var17._M_p = (pointer)local_1b0;
          if (local_1b0 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0) goto LAB_0051243b;
        }
        else {
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          pcVar1 = (local_120->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_180,pcVar1,pcVar1 + local_120->_M_string_length);
          uVar16 = local_118;
          std::__cxx11::string::append((char *)&local_180);
          plVar10 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_180,(ulong)local_140._M_dataplus._M_p);
          puVar18 = (ulong *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar18) {
            local_1a0._0_8_ = *puVar18;
            local_1a0._8_8_ = plVar10[3];
            local_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1a0;
          }
          else {
            local_1a0._0_8_ = *puVar18;
            local_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar10;
          }
          local_1a8._M_p = (pointer)plVar10[1];
          *plVar10 = (long)puVar18;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_110,(string *)&local_1b0);
          if (local_1b0 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0) {
            operator_delete(local_1b0,local_1a0._0_8_ + 1);
          }
          uVar15 = local_180.field_2._M_allocated_capacity;
          _Var17._M_p = local_180._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
LAB_0051243b:
            operator_delete(_Var17._M_p,uVar15 + 1);
          }
        }
        bVar6 = Directory::FileIsDirectory(&local_b0,uVar16);
        bVar7 = Directory::FileIsSymlink(&local_b0,uVar16);
        if (bVar6) {
          if (bVar7) {
            if (this->RecurseThroughSymlinks != true) goto LAB_00512597;
            this->FollowedSymlinkCount = this->FollowedSymlinkCount + 1;
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            local_180._M_string_length = 0;
            local_180.field_2._M_allocated_capacity =
                 local_180.field_2._M_allocated_capacity & 0xffffffffffffff00;
            SystemTools::GetRealPath(&local_f0,local_120,&local_180);
            if (local_180._M_string_length != 0) {
              if (local_188 != (GlobMessages *)0x0) {
                std::operator+(&local_50,"Canonical path generation from path \'",local_120);
                plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
                psVar14 = (size_type *)(plVar10 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar10 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar14) {
                  local_70.field_2._M_allocated_capacity = *psVar14;
                  local_70.field_2._8_8_ = plVar10[3];
                  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                }
                else {
                  local_70.field_2._M_allocated_capacity = *psVar14;
                  local_70._M_dataplus._M_p = (pointer)*plVar10;
                }
                local_70._M_string_length = plVar10[1];
                *plVar10 = (long)psVar14;
                plVar10[1] = 0;
                *(undefined1 *)(plVar10 + 2) = 0;
                std::operator+(&local_d0,&local_70,&local_180);
                plVar10 = (long *)std::__cxx11::string::append((char *)&local_d0);
                puVar18 = (ulong *)(plVar10 + 2);
                if ((ulong *)*plVar10 == puVar18) {
                  local_150 = *puVar18;
                  uStack_148 = (undefined4)plVar10[3];
                  uStack_144 = *(undefined4 *)((long)plVar10 + 0x1c);
                  local_160 = &local_150;
                }
                else {
                  local_150 = *puVar18;
                  local_160 = (ulong *)*plVar10;
                }
                local_158 = plVar10[1];
                *plVar10 = (long)puVar18;
                plVar10[1] = 0;
                *(undefined1 *)(plVar10 + 2) = 0;
                local_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((ulong)local_1b0 & 0xffffffff00000000);
                local_1a8._M_p = local_1a0 + 8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1a8,local_160,local_158 + (long)local_160);
                std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::
                emplace_back<cmsys::Glob::Message>(local_188,(Message *)&local_1b0);
                if (local_1a8._M_p != local_1a0 + 8) {
                  operator_delete(local_1a8._M_p,local_1a0._8_8_ + 1);
                }
                if (local_160 != &local_150) {
                  operator_delete(local_160,local_150 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                  operator_delete(local_d0._M_dataplus._M_p,
                                  local_d0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70._M_dataplus._M_p != &local_70.field_2) {
                  operator_delete(local_70._M_dataplus._M_p,
                                  local_70.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_00512bf0:
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
              }
LAB_00512bf8:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              break;
            }
            _Var12 = std::
                     __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                               ((this->VisitedSymlinks).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (this->VisitedSymlinks).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish,&local_f0);
            pbVar2 = (this->VisitedSymlinks).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (_Var12._M_current == pbVar2) {
              if (this->RecurseListDirs == true) {
                AddFile(this,&this->Internals->Files,&local_110);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(local_a8,&local_f0);
              bVar6 = RecurseDirectory(this,local_a0,&local_110,local_188);
              pbVar4 = (this->VisitedSymlinks).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              (this->VisitedSymlinks).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = pbVar4 + -1;
              puVar18 = (ulong *)pbVar4[-1]._M_dataplus._M_p;
              paVar13 = &pbVar4[-1].field_2;
              if (!bVar6) {
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar18 != paVar13) {
                  local_50.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                  local_50._M_dataplus._M_p = (pointer)puVar18;
                  goto LAB_00512bf0;
                }
                goto LAB_00512bf8;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar18 != paVar13) {
                uVar16 = paVar13->_M_allocated_capacity;
                goto LAB_00512814;
              }
            }
            else if (local_188 != (GlobMessages *)0x0) {
              local_160 = &local_150;
              local_158 = 0;
              local_150 = local_150 & 0xffffffffffffff00;
              for (_Var12 = std::
                            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                      ((local_a8->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start,pbVar2,&local_f0);
                  _Var12._M_current !=
                  (this->VisitedSymlinks).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
                  _Var12._M_current = _Var12._M_current + 1) {
                pcVar1 = ((_Var12._M_current)->_M_dataplus)._M_p;
                local_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1a0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1b0,pcVar1,
                           pcVar1 + (_Var12._M_current)->_M_string_length);
                std::__cxx11::string::append((char *)&local_1b0);
                std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_1b0);
                if (local_1b0 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a0) {
                  operator_delete(local_1b0,local_1a0._0_8_ + 1);
                }
              }
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_d0,local_f0._M_dataplus._M_p,
                         local_f0._M_dataplus._M_p + local_f0._M_string_length);
              std::__cxx11::string::append((char *)&local_d0);
              plVar10 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_d0,(ulong)local_140._M_dataplus._M_p);
              puVar18 = (ulong *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar18) {
                local_1a0._0_8_ = *puVar18;
                local_1a0._8_8_ = plVar10[3];
                local_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1a0;
              }
              else {
                local_1a0._0_8_ = *puVar18;
                local_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*plVar10;
              }
              local_1a8._M_p = (pointer)plVar10[1];
              *plVar10 = (long)puVar18;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_1b0);
              if (local_1b0 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0) {
                operator_delete(local_1b0,local_1a0._0_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1
                               );
              }
              local_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_1b0._4_4_,2);
              local_1a8._M_p = local_1a0 + 8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1a8,local_160,local_158 + (long)local_160);
              std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::
              emplace_back<cmsys::Glob::Message>(local_188,(Message *)&local_1b0);
              if (local_1a8._M_p != local_1a0 + 8) {
                operator_delete(local_1a8._M_p,local_1a0._8_8_ + 1);
              }
              uVar16 = local_150;
              puVar18 = local_160;
              if (local_160 != &local_150) {
LAB_00512814:
                operator_delete(puVar18,uVar16 + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            if (this->RecurseListDirs == true) {
              AddFile(this,&this->Internals->Files,&local_110);
            }
            bVar6 = RecurseDirectory(this,local_a0,&local_110,local_188);
            if (!bVar6) break;
          }
        }
        else {
LAB_00512597:
          pRVar3 = (this->Internals->Expressions).
                   super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (((this->Internals->Expressions).
               super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
               ._M_impl.super__Vector_impl_data._M_start != pRVar3) &&
             (this_00 = pRVar3 + -1,
             bVar19 = RegularExpression::find(this_00,local_140._M_dataplus._M_p,&this_00->regmatch)
             , bVar19)) {
            AddFile(this,&this->Internals->Files,&local_110);
          }
        }
      }
      local_118 = local_118 + 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    local_f0.field_2._M_allocated_capacity = local_110.field_2._M_allocated_capacity;
    local_f0._M_dataplus._M_p = local_110._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p == &local_110.field_2) goto LAB_00512c87;
  }
  else {
    bVar19 = true;
    if ((local_188 == (GlobMessages *)0x0) || (local_90._M_string_length == 0)) goto LAB_00512c87;
    std::operator+(&local_f0,"Error listing directory \'",local_120);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_f0);
    puVar18 = (ulong *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar18) {
      local_180.field_2._M_allocated_capacity = *puVar18;
      local_180.field_2._8_8_ = plVar10[3];
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    }
    else {
      local_180.field_2._M_allocated_capacity = *puVar18;
      local_180._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_180._M_string_length = plVar10[1];
    *plVar10 = (long)puVar18;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_180,(ulong)local_90._M_dataplus._M_p);
    puVar18 = (ulong *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar18) {
      local_140.field_2._M_allocated_capacity = *puVar18;
      local_140.field_2._8_8_ = plVar10[3];
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    }
    else {
      local_140.field_2._M_allocated_capacity = *puVar18;
      local_140._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_140._M_string_length = plVar10[1];
    *plVar10 = (long)puVar18;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_140);
    puVar18 = (ulong *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar18) {
      local_110.field_2._M_allocated_capacity = *puVar18;
      local_110.field_2._8_4_ = (undefined4)plVar10[3];
      local_110.field_2._12_4_ = *(undefined4 *)((long)plVar10 + 0x1c);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *puVar18;
      local_110._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_110._M_string_length = plVar10[1];
    *plVar10 = (long)puVar18;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    local_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_1b0._4_4_,1);
    local_1a8._M_p = local_1a0 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a8,local_110._M_dataplus._M_p,
               local_110._M_dataplus._M_p + local_110._M_string_length);
    std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::
    emplace_back<cmsys::Glob::Message>(local_188,(Message *)&local_1b0);
    if (local_1a8._M_p != local_1a0 + 8) {
      operator_delete(local_1a8._M_p,local_1a0._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p == &local_f0.field_2) goto LAB_00512c87;
  }
  operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
LAB_00512c87:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  Directory::~Directory(&local_b0);
  return bVar19;
}

Assistant:

bool Glob::RecurseDirectory(std::string::size_type start,
                            const std::string& dir, GlobMessages* messages)
{
  kwsys::Directory d;
  std::string errorMessage;
  if (!d.Load(dir, &errorMessage)) {
    if (messages) {
      if (!errorMessage.empty()) {
        messages->push_back(Message(Glob::warning,
                                    "Error listing directory '" + dir +
                                      "'! Reason: '" + errorMessage + "'"));
      }
    }
    return true;
  }
  unsigned long cc;
  std::string realname;
  std::string fname;
  for (cc = 0; cc < d.GetNumberOfFiles(); cc++) {
    fname = d.GetFile(cc);
    if (fname == "." || fname == "..") {
      continue;
    }

    if (start == 0) {
      realname = dir + fname;
    } else {
      realname = dir + "/" + fname;
    }

#if defined(KWSYS_GLOB_CASE_INDEPENDENT)
    // On Windows and Apple, no difference between lower and upper case
    fname = kwsys::SystemTools::LowerCase(fname);
#endif

    bool isDir = d.FileIsDirectory(cc);
    bool isSymLink = d.FileIsSymlink(cc);

    if (isDir && (!isSymLink || this->RecurseThroughSymlinks)) {
      if (isSymLink) {
        ++this->FollowedSymlinkCount;
        std::string realPathErrorMessage;
        std::string canonicalPath(
          SystemTools::GetRealPath(dir, &realPathErrorMessage));

        if (!realPathErrorMessage.empty()) {
          if (messages) {
            messages->push_back(
              Message(Glob::error,
                      "Canonical path generation from path '" + dir +
                        "' failed! Reason: '" + realPathErrorMessage + "'"));
          }
          return false;
        }

        if (std::find(this->VisitedSymlinks.begin(),
                      this->VisitedSymlinks.end(),
                      canonicalPath) == this->VisitedSymlinks.end()) {
          if (this->RecurseListDirs) {
            // symlinks are treated as directories
            this->AddFile(this->Internals->Files, realname);
          }

          this->VisitedSymlinks.push_back(canonicalPath);
          if (!this->RecurseDirectory(start + 1, realname, messages)) {
            this->VisitedSymlinks.pop_back();

            return false;
          }
          this->VisitedSymlinks.pop_back();
        }
        // else we have already visited this symlink - prevent cyclic recursion
        else if (messages) {
          std::string message;
          for (std::vector<std::string>::const_iterator pathIt =
                 std::find(this->VisitedSymlinks.begin(),
                           this->VisitedSymlinks.end(), canonicalPath);
               pathIt != this->VisitedSymlinks.end(); ++pathIt) {
            message += *pathIt + "\n";
          }
          message += canonicalPath + "/" + fname;
          messages->push_back(Message(Glob::cyclicRecursion, message));
        }
      } else {
        if (this->RecurseListDirs) {
          this->AddFile(this->Internals->Files, realname);
        }
        if (!this->RecurseDirectory(start + 1, realname, messages)) {
          return false;
        }
      }
    } else {
      if (!this->Internals->Expressions.empty() &&
          this->Internals->Expressions.back().find(fname)) {
        this->AddFile(this->Internals->Files, realname);
      }
    }
  }

  return true;
}